

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BasicNetwork.hpp
# Opt level: O0

void __thiscall
BasicNetwork<LifNeuron,_LifSynapse,_PreciseEventManager>::Reset
          (BasicNetwork<LifNeuron,_LifSynapse,_PreciseEventManager> *this)

{
  bool bVar1;
  map<unsigned_long,_INeuron_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_INeuron_*>_>_>
  *this_00;
  reference ppVar2;
  pair<const_unsigned_long,_INeuron_*> id_ptr;
  iterator __end0;
  iterator __begin0;
  map<unsigned_long,_INeuron_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_INeuron_*>_>_>
  *__range1;
  BasicNetwork<LifNeuron,_LifSynapse,_PreciseEventManager> *this_local;
  
  this_00 = &(this->super_INetwork).neuronMap;
  __end0 = std::
           map<unsigned_long,_INeuron_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_INeuron_*>_>_>
           ::begin(this_00);
  id_ptr.second =
       (INeuron *)
       std::
       map<unsigned_long,_INeuron_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_INeuron_*>_>_>
       ::end(this_00);
  while( true ) {
    bVar1 = std::operator!=(&__end0,(_Self *)&id_ptr.second);
    if (!bVar1) break;
    ppVar2 = std::_Rb_tree_iterator<std::pair<const_unsigned_long,_INeuron_*>_>::operator*(&__end0);
    id_ptr.first = (unsigned_long)ppVar2->second;
    (*((INeuron *)id_ptr.first)->_vptr_INeuron[5])();
    std::_Rb_tree_iterator<std::pair<const_unsigned_long,_INeuron_*>_>::operator++(&__end0);
  }
  return;
}

Assistant:

void BasicNetwork<Neuron, Synapse, EventManager>::Reset()
{
    for ( auto id_ptr : neuronMap ) {
        id_ptr.second->Reset();
    }
}